

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomNumberGenerator.cc
# Opt level: O3

void __thiscall
OpenMesh::RandomNumberGenerator::RandomNumberGenerator
          (RandomNumberGenerator *this,size_t _resolution)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  double dVar5;
  
  this->resolution_ = _resolution;
  this->iterations_ = 1;
  this->maxNum_ = 2147483648.0;
  if (0x80000000 < _resolution) {
    auVar4._8_4_ = (int)(_resolution >> 0x20);
    auVar4._0_8_ = _resolution;
    auVar4._12_4_ = 0x45300000;
    dVar5 = (auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)_resolution) - 4503599627370496.0);
    lVar1 = 0;
    do {
      dVar5 = dVar5 * 4.656612873077393e-10;
      lVar1 = lVar1 + -1;
    } while (2147483648.0 < dVar5);
    this->iterations_ = 1 - lVar1;
    if (lVar1 != 0) {
      uVar2 = 1;
      dVar5 = 2147483648.0;
      do {
        dVar5 = dVar5 * 2147483648.0;
        uVar3 = (ulong)uVar2;
        uVar2 = uVar2 + 1;
      } while (uVar3 <= (ulong)-lVar1 && -uVar3 != lVar1);
      this->maxNum_ = dVar5;
    }
  }
  return;
}

Assistant:

RandomNumberGenerator::RandomNumberGenerator(const size_t _resolution) :
  resolution_(_resolution),
  iterations_(1),
  maxNum_(RAND_MAX + 1.0)
{
  double tmp = double(resolution_);
  while (tmp > (double(RAND_MAX) + 1.0) ) {
    iterations_++;
    tmp /= (double(RAND_MAX) + 1.0);
  }

  for ( unsigned int i = 0 ; i < iterations_ - 1; ++i ) {
    maxNum_ *= (RAND_MAX + 1.0);
  }
}